

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
 __thiscall pstore::index::details::linear_node::allocate(linear_node *this,address a,address b)

{
  linear_node *this_00;
  type plVar1;
  address *paVar2;
  address b_local;
  address a_local;
  unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
  *result;
  
  this_00 = (linear_node *)operator_new(0x18,(nchildren)0x2);
  linear_node(this_00,2);
  std::
  unique_ptr<pstore::index::details::linear_node,std::default_delete<pstore::index::details::linear_node>>
  ::unique_ptr<std::default_delete<pstore::index::details::linear_node>,void>
            ((unique_ptr<pstore::index::details::linear_node,std::default_delete<pstore::index::details::linear_node>>
              *)this,this_00);
  plVar1 = std::
           unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
           ::operator*((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                        *)this);
  paVar2 = operator[](plVar1,0);
  paVar2->a_ = a.a_;
  plVar1 = std::
           unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
           ::operator*((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                        *)this);
  paVar2 = operator[](plVar1,1);
  paVar2->a_ = b.a_;
  return (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
          )(__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<linear_node> linear_node::allocate (address const a, address const b) {
                auto result = std::unique_ptr<linear_node> (new (nchildren{2U}) linear_node (2U));
                (*result)[0] = a;
                (*result)[1] = b;
                return result;
            }